

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EtherCATStack.cpp
# Opt level: O3

EC_T_DWORD myAppPrepare(CAtEmLogging *poLog,EC_T_INT nVerbose)

{
  EC_T_BOOL EVar1;
  int iVar2;
  EC_T_DWORD EVar3;
  ulong uVar4;
  EC_T_WORD wFixedAddress;
  EC_T_WORD local_a;
  
  CAtEmLogging::LogMsg(S_poLog,"prepare");
  local_a = 0;
  EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x3ec3052,&local_a);
  if (((EVar1 != 0) || (EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x3f43052,&local_a), EVar1 != 0))
     || (EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x3f63052,&local_a), EVar1 != 0)) {
    S_dwSlaveIdx14 = S_dwAppFoundSlaves;
  }
  if (S_dwSlaveIdx14 != 0xffff) {
    S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
    iVar2 = emGetCfgSlaveInfo(0,1,local_a,S_aSlaveList + S_dwSlaveIdx14);
    if (iVar2 != 0) {
      CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
    }
  }
  EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x7d83052,&local_a);
  if (((EVar1 != 0) || (EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x7d43052,&local_a), EVar1 != 0))
     || (EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x7d23052,&local_a), EVar1 != 0)) {
    S_dwSlaveIdx24 = S_dwAppFoundSlaves;
  }
  if (S_dwSlaveIdx24 != 0xffff) {
    S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
    iVar2 = emGetCfgSlaveInfo(0,1,local_a,S_aSlaveList + S_dwSlaveIdx24);
    if (iVar2 != 0) {
      CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
    }
  }
  EVar1 = FindSlaveGetFixedAddr(0,poLog,0,2,0x10243052,&local_a);
  if (EVar1 != 0) {
    uVar4 = (ulong)S_dwAppFoundSlaves;
    S_dwSlaveIdx4132 = S_dwAppFoundSlaves;
    S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
    iVar2 = emGetCfgSlaveInfo(0,1,local_a,S_aSlaveList + uVar4);
    if (iVar2 != 0) {
      CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
    }
  }
  EVar3 = FindSlaveGetFixedAddr(0,poLog,0,4,6,&local_a);
  if (EVar3 != 0) {
    uVar4 = (ulong)S_dwAppFoundSlaves;
    S_dwSlaveIdxETCio100 = S_dwAppFoundSlaves;
    S_dwAppFoundSlaves = S_dwAppFoundSlaves + 1;
    EVar3 = emGetCfgSlaveInfo(0,1,local_a,S_aSlaveList + uVar4);
    if (EVar3 != 0) {
      EVar3 = CAtEmLogging::LogError(S_poLog,"ERROR: ecatGetCfgSlaveInfo() returns with error.");
    }
  }
  return EVar3;
}

Assistant:

static EC_T_DWORD myAppPrepare(
    CAtEmLogging*       poLog,          /* [in]  Logging instance */ 
    EC_T_INT            nVerbose        /* [in]  Verbosity level */
    )
{
	LogMsg( "prepare" );
	
	
EC_T_WORD wFixedAddress = 0;

    EC_UNREFPARM(nVerbose);

    /* Searching for: EL1004, EL1012, EL1014                                       */
    /* search for the first device at the bus and return its fixed (EtherCAT) address */
    if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL1004, &wFixedAddress))
    {
        S_dwSlaveIdx14 = S_dwAppFoundSlaves;
    }
    else if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL1012, &wFixedAddress))
    {
        S_dwSlaveIdx14 = S_dwAppFoundSlaves;
    }
    else if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL1014, &wFixedAddress))
    {
        S_dwSlaveIdx14 = S_dwAppFoundSlaves;
    }
    if (S_dwSlaveIdx14 != SLAVE_NOT_FOUND)
    {
        S_dwAppFoundSlaves++;

        /* now get the offset of this device in the process data buffer and some other infos */
        if (ecatGetCfgSlaveInfo(EC_TRUE, wFixedAddress, &S_aSlaveList[S_dwSlaveIdx14]) != EC_E_NOERROR)
        {
            LogError("ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
    }
    /* Searching for: EL2002, EL2004, EL2008                                       */
    /* search for the first device at the bus and return its fixed (EtherCAT) address */
    if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL2008, &wFixedAddress))
    {
        S_dwSlaveIdx24 = S_dwAppFoundSlaves;
    }
    else if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL2004, &wFixedAddress))
    {
        S_dwSlaveIdx24 = S_dwAppFoundSlaves;
    }
    else if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL2002, &wFixedAddress))
    {
        S_dwSlaveIdx24 = S_dwAppFoundSlaves;
    }
    if (S_dwSlaveIdx24 != SLAVE_NOT_FOUND)
    {
        S_dwAppFoundSlaves++;

        /* now get the offset of this device in the process data buffer and some other infos */
        if (ecatGetCfgSlaveInfo(EC_TRUE, wFixedAddress, &S_aSlaveList[S_dwSlaveIdx24]) != EC_E_NOERROR)
        {
            LogError("ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
    }

    /* Searching for: EL4132                                                       */
    /* search for the first device at the bus and return its fixed (EtherCAT) address */
    if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_beckhoff, ecprodcode_beck_EL4132, &wFixedAddress))
    {
        S_dwSlaveIdx4132 = S_dwAppFoundSlaves;
        S_dwAppFoundSlaves++;
        /* now get the offset of this device in the process data buffer and some other infos */
        if (ecatGetCfgSlaveInfo(EC_TRUE, wFixedAddress, &S_aSlaveList[S_dwSlaveIdx4132]) != EC_E_NOERROR)
        {
            LogError("ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
    }
    /* Searching for: IXXAT ETCio100                                                    */
    /* search for the first device at the bus and return its fixed (EtherCAT) address */
    if (FindSlaveGetFixedAddr(INSTANCE_MASTER_DEFAULT, poLog, 0, ecvendor_ixxat, ecprodcode_ixx_ETCio100, &wFixedAddress))
    {
        S_dwSlaveIdxETCio100 = S_dwAppFoundSlaves;
        S_dwAppFoundSlaves++;
        /* now get the offset of this device in the process data buffer and some other infos */
        if (ecatGetCfgSlaveInfo(EC_TRUE, wFixedAddress, &S_aSlaveList[S_dwSlaveIdxETCio100]) != EC_E_NOERROR)
        {
            LogError("ERROR: ecatGetCfgSlaveInfo() returns with error.");
        }
    }
    return EC_E_NOERROR;
}